

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_clear(void)

{
  initializer_list<int> input;
  undefined4 local_7c;
  size_type local_78 [2];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_78[0] = 0x160000000b;
  local_78[1] = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)local_78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  local_78[0] = span.member.size;
  local_7c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x112,"void api_dynamic_suite::dynamic_clear()",local_78,&local_7c);
  span.member.size = 0;
  local_78[0] = 0;
  span.member.next = span.member.cap;
  local_7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x114,"void api_dynamic_suite::dynamic_clear()",local_78,&local_7c);
  return;
}

Assistant:

void dynamic_clear()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.clear();
    BOOST_TEST_EQ(span.size(), 0);
}